

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::scan
               (Scanner *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_Scanner_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_0069a3be:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_0069a05b:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_0069a3be;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_0069a044;
  case LoopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_0069a3be;
    }
    goto LAB_00699c2c;
  case BreakId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_0069a3be;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_0069987f;
  case SwitchId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSwitch,currp)
    ;
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_0069a3be;
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x0069962e;
  case CallId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_0069a3be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallIndirect,
               currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_0069a3be;
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalGet,
               currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_0069a3be;
    }
    break;
  case LocalSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLocalSet,
               currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d1a;
  case GlobalGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalGet,
               currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_0069a3be;
    }
    break;
  case GlobalSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitGlobalSet,
               currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699c2c;
  case LoadId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_0069a3be;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00699f95;
  case StoreId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_0069a3be;
    }
    goto LAB_00699ce3;
  case ConstId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_0069a3be;
    }
    break;
  case UnaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d1a;
  case BinaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBinary,currp)
    ;
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f75;
  case SelectId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSelect,currp)
    ;
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_0069a3be;
    }
    goto LAB_0069994f;
  case DropId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case ReturnId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitReturn,currp)
    ;
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_0069a3be;
    }
    goto LAB_00699625;
  case MemorySizeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemorySize,
               currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_0069a3be;
    }
    break;
  case MemoryGrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryGrow,
               currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case NopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_0069a3be;
    }
    break;
  case UnreachableId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitUnreachable,
               currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_0069a3be;
    }
    break;
  case AtomicRMWId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicRMW,
               currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_0069a3be;
    }
    goto LAB_00699db9;
  case AtomicCmpxchgId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicCmpxchg
               ,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d9f;
  case AtomicWaitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicWait,
               currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_0069a3be;
    }
    goto LAB_006994bc;
  case AtomicNotifyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicNotify,
               currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f75;
  case AtomicFenceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitAtomicFence,
               currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_0069a3be;
    }
    break;
  case SIMDExtractId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDExtract,
               currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d1a;
  case SIMDReplaceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDReplace,
               currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_0069a3be;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00699f80;
  case SIMDShuffleId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShuffle,
               currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_0069a3be;
    }
    goto LAB_00699ef3;
  case SIMDTernaryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDTernary,
               currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_0069a3be;
    }
    goto LAB_006994bc;
  case SIMDShiftId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDShift,
               currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f75;
  case SIMDLoadId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitSIMDLoad,
               currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_0069a3be;
    }
    goto LAB_00699b61;
  case SIMDLoadStoreLaneId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_0069a3be;
    }
LAB_00699ce3:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00699f95;
  case MemoryInitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryInit,
               currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_0069a3be;
    }
LAB_00699d9f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00699db9;
  case DataDropId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitDataDrop,
               currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_0069a3be;
    }
    break;
  case MemoryCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryCopy,
               currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_0069a3be;
    }
    goto LAB_0069994f;
  case MemoryFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitMemoryFill,
               currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_0069a3be;
    }
    goto LAB_0069994f;
  case PopId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_0069a3be;
    }
    break;
  case RefNullId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefNull,currp
              );
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_0069a3be;
    }
    break;
  case RefIsNullId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefIsNull,
               currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case RefFuncId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefFunc,currp
              );
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_0069a3be;
    }
    break;
  case RefEqId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_0069a3be;
    }
    goto LAB_00699ef3;
  case TableGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGet,
               currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699c2c;
  case TableSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSet,
               currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699db9;
  case TableSizeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableSize,
               currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_0069a3be;
    }
    break;
  case TableGrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTableGrow,
               currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_0069a3be;
    }
LAB_00699db9:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00699f95;
  case TryId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_0069a3be;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_00699c2c:
    pEVar1 = pEVar1 + 2;
    goto LAB_00699f95;
  case ThrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_0069a3be;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRethrow,currp
              );
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_0069a3be;
    }
    break;
  case TupleMakeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleMake,
               currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_0069a3be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitTupleExtract,
               currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case I31NewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitI31New,currp)
    ;
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case I31GetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitI31Get,currp)
    ;
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case CallRefId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitCallRef,currp
              );
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_0069a3be;
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefTest,currp
              );
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case RefCastId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefCast,currp
              );
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case BrOnId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_0069a3be;
    }
LAB_00699b61:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00699f95;
  case StructNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructNew,
               currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_0069a3be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructGet,
               currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d1a;
  case StructSetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStructSet,
               currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f75;
  case ArrayNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNew,
               currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_0069a3be;
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_00699625:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x0069962e:
    if (lVar5 != 0) {
LAB_0069987f:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewSeg,
               currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_0069a3be;
    }
    goto LAB_006996cd;
  case ArrayNewFixedId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayNewFixed
               ,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_0069a3be;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0069a05b;
        Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
                  ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayGet,
               currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_0069a3be;
    }
    goto LAB_00699ef3;
  case ArraySetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArraySet,
               currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_0069a3be;
    }
    goto LAB_0069994f;
  case ArrayLenId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayLen,
               currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f4d;
  case ArrayCopyId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayCopy,
               currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_0069a3be;
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_0069945e;
  case ArrayFillId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayFill,
               currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_0069a3be;
    }
LAB_0069945e:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_0069994f;
  case ArrayInitId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitArrayInit,
               currp);
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_0069a3be;
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_006996cd:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00699f95;
  case RefAsId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d1a;
  case StringNewId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringNew,
               currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_0069a3be;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_0069a044;
  case StringConstId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConst,
               currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_0069a3be;
    }
    break;
  case StringMeasureId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringMeasure
               ,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_0069a3be;
    }
    goto LAB_00699d1a;
  case StringEncodeId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEncode,
               currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_0069a3be;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,wasm::UnifiedExpressionVisitor<wasm::BranchUtils::getBranchTargets(wasm::Expression*)::Scanner,void>>::Task,10ul>
                  *)&(self->
                     super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
                     super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_0069a044:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringConcat,
               currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_0069a3be;
    }
    goto LAB_00699ef3;
  case StringEqId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringEq,
               currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_0069a3be;
    }
    goto LAB_00699f75;
  case StringAsId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::doVisitStringAs,
               currp);
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_0069a3be;
    }
LAB_00699d1a:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00699f95;
  case StringWTF8AdvanceId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_0069a3be;
    }
LAB_0069994f:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_00699ef3;
  case StringWTF16GetId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_0069a3be;
    }
    goto LAB_00699ef3;
  case StringIterNextId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringIterNext,currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_0069a3be;
    }
LAB_00699f4d:
    pEVar1 = pEVar1 + 1;
LAB_00699f95:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringIterMove,currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_0069a3be;
    }
LAB_00699f75:
    currp_00 = pEVar1 + 2;
LAB_00699f80:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00699f95;
  case StringSliceWTFId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_0069a3be;
    }
LAB_006994bc:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00699f80;
  case StringSliceIterId:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,
               Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::
               doVisitStringSliceIter,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_0069a3be;
    }
LAB_00699ef3:
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::pushTask
              ((Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00699f95;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }